

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-async.c
# Opt level: O2

void worker_async_cb(uv_async_t *handle)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = uv_async_send(handle + -1);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-async.c"
            ,0x2e,"0 == uv_async_send(&ctx->main_async)");
    abort();
  }
  uVar1 = *(undefined8 *)((long)&handle[1].loop + 4);
  uVar3 = (int)uVar1 + 1;
  *(ulong *)((long)&handle[1].loop + 4) = CONCAT44((int)((ulong)uVar1 >> 0x20) + 1,uVar3);
  if (999999 < uVar3) {
    uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
    return;
  }
  return;
}

Assistant:

static void worker_async_cb(uv_async_t* handle) {
  struct ctx* ctx = container_of(handle, struct ctx, worker_async);

  ASSERT(0 == uv_async_send(&ctx->main_async));
  ctx->worker_sent++;
  ctx->worker_seen++;

  if (ctx->worker_sent >= NUM_PINGS)
    uv_close((uv_handle_t*) &ctx->worker_async, NULL);
}